

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O3

KFIXED<char,_(unsigned_char)__x03_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::operator[]
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,KUINT16 i)

{
  KException *this_00;
  KString local_40;
  
  if (i < 3) {
    return (KFIXED<char,_(unsigned_char)__x03_> *)
           ((long)&(this->super_DataTypeBase)._vptr_DataTypeBase + (ulong)((i & 0xfff) << 4 | 8));
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"operator[]","");
  KException::KException(this_00,&local_40,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

const Type &LE_Vector<Type>::operator[](KUINT16 i) const noexcept(false)
{
    switch( i )
    {
    case 0:
        return m_X;
    case 1:
        return m_Y;
    case 2:
        return m_Z;
    default:
        throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}